

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ExportYUVA(VP8LDecoder *dec,int y_pos)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int num_lines_out;
  int dst_width;
  uint32_t *src;
  WebPRescaler *rescaler;
  int local_28;
  WebPRescaler *rescaler_00;
  undefined4 in_stack_fffffffffffffff0;
  
  rescaler_00 = *(WebPRescaler **)(*(long *)(in_RDI + 0x188) + 0x48);
  iVar1 = *(int *)(*(long *)(in_RDI + 0x188) + 0x34);
  local_28 = 0;
  while( true ) {
    iVar2 = WebPRescalerHasPendingOutput(rescaler_00);
    if (iVar2 == 0) break;
    WebPRescalerExportRow(rescaler_00);
    (*WebPMultARGBRow)((uint32_t *)rescaler_00,iVar1,1);
    ConvertToYUVA(_num_lines_out,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                  (WebPDecBuffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    in_ESI = in_ESI + 1;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static int ExportYUVA(const VP8LDecoder* const dec, int y_pos) {
  WebPRescaler* const rescaler = dec->rescaler;
  uint32_t* const src = (uint32_t*)rescaler->dst;
  const int dst_width = rescaler->dst_width;
  int num_lines_out = 0;
  while (WebPRescalerHasPendingOutput(rescaler)) {
    WebPRescalerExportRow(rescaler);
    WebPMultARGBRow(src, dst_width, 1);
    ConvertToYUVA(src, dst_width, y_pos, dec->output_);
    ++y_pos;
    ++num_lines_out;
  }
  return num_lines_out;
}